

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O1

SourceLocation __thiscall
slang::SourceManager::getOriginalLoc(SourceManager *this,SourceLocation location)

{
  pointer pvVar1;
  ulong uVar2;
  variant_alternative_t<1UL,_variant<FileInfo,_ExpansionInfo>_> *pvVar3;
  ulong uVar4;
  SourceLocation SVar5;
  
  if (((ulong)location & 0xfffffff) == 0) {
    SVar5 = (SourceLocation)0x0;
  }
  else {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
    uVar2 = (ulong)(location._0_4_ & 0xfffffff);
    pvVar1 = (this->bufferEntries).
             super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(this->bufferEntries).
                   super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
            0x6db6db6db6db6db7;
    if (uVar4 < uVar2 || uVar4 - uVar2 == 0) {
      assert::assertFailed
                ("buffer.getId() < bufferEntries.size()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/text/SourceManager.cpp"
                 ,0xf4,"SourceLocation slang::SourceManager::getOriginalLoc(SourceLocation) const");
    }
    pvVar3 = std::get<1ul,slang::SourceManager::FileInfo,slang::SourceManager::ExpansionInfo>
                       (pvVar1 + uVar2);
    SVar5 = (SourceLocation)(((ulong)location & 0xfffffffff0000000) + (long)pvVar3->originalLoc);
    pthread_rwlock_unlock((pthread_rwlock_t *)this);
  }
  return SVar5;
}

Assistant:

void SourceManager::addUserDirectory(string_view path) {
    std::unique_lock lock(mut);
    userDirectories.push_back(fs::canonical(widen(path)));
}